

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void idct32_stage4_avx2(__m256i *bf1,__m256i *cospim8,__m256i *cospi56,__m256i *cospi8,
                       __m256i *cospim56,__m256i *cospim40,__m256i *cospi24,__m256i *cospi40,
                       __m256i *cospim24,__m256i *rounding,int bit)

{
  __m256i *in_RCX;
  __m256i *in_RDX;
  __m256i *in_RSI;
  __m256i *in_RDI;
  undefined8 in_R8;
  longlong in_XMM0_Qa;
  longlong lVar1;
  longlong in_XMM0_Qb;
  longlong lVar2;
  longlong in_YMM0_H;
  longlong lVar3;
  longlong in_register_00001218;
  longlong lVar4;
  int bit_00;
  __m256i *in_stack_ffffffffffffffd0;
  
  bit_00 = (int)((ulong)in_R8 >> 0x20);
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  lVar1 = in_XMM0_Qa;
  lVar2 = in_XMM0_Qb;
  lVar3 = in_YMM0_H;
  lVar4 = in_register_00001218;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  in_RDI[0x1e][0] = lVar1;
  in_RDI[0x1e][1] = lVar2;
  in_RDI[0x1e][2] = lVar3;
  in_RDI[0x1e][3] = lVar4;
  in_RDI[0x11][0] = in_XMM0_Qa;
  in_RDI[0x11][1] = in_XMM0_Qb;
  in_RDI[0x11][2] = in_YMM0_H;
  in_RDI[0x11][3] = in_register_00001218;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  lVar1 = in_XMM0_Qa;
  lVar2 = in_XMM0_Qb;
  lVar3 = in_YMM0_H;
  lVar4 = in_register_00001218;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  in_RDI[0x1d][0] = lVar1;
  in_RDI[0x1d][1] = lVar2;
  in_RDI[0x1d][2] = lVar3;
  in_RDI[0x1d][3] = lVar4;
  in_RDI[0x12][0] = in_XMM0_Qa;
  in_RDI[0x12][1] = in_XMM0_Qb;
  in_RDI[0x12][2] = in_YMM0_H;
  in_RDI[0x12][3] = in_register_00001218;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  lVar1 = in_XMM0_Qa;
  lVar2 = in_XMM0_Qb;
  lVar3 = in_YMM0_H;
  lVar4 = in_register_00001218;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  in_RDI[0x1a][0] = lVar1;
  in_RDI[0x1a][1] = lVar2;
  in_RDI[0x1a][2] = lVar3;
  in_RDI[0x1a][3] = lVar4;
  in_RDI[0x15][0] = in_XMM0_Qa;
  in_RDI[0x15][1] = in_XMM0_Qb;
  in_RDI[0x15][2] = in_YMM0_H;
  in_RDI[0x15][3] = in_register_00001218;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  lVar1 = in_XMM0_Qa;
  lVar2 = in_XMM0_Qb;
  lVar3 = in_YMM0_H;
  lVar4 = in_register_00001218;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  in_RDI[0x19][0] = lVar1;
  in_RDI[0x19][1] = lVar2;
  in_RDI[0x19][2] = lVar3;
  in_RDI[0x19][3] = lVar4;
  in_RDI[0x16][0] = in_XMM0_Qa;
  in_RDI[0x16][1] = in_XMM0_Qb;
  in_RDI[0x16][2] = in_YMM0_H;
  in_RDI[0x16][3] = in_register_00001218;
  return;
}

Assistant:

static inline void idct32_stage4_avx2(
    __m256i *bf1, const __m256i *cospim8, const __m256i *cospi56,
    const __m256i *cospi8, const __m256i *cospim56, const __m256i *cospim40,
    const __m256i *cospi24, const __m256i *cospi40, const __m256i *cospim24,
    const __m256i *rounding, int bit) {
  __m256i temp1, temp2;
  temp1 = half_btf_avx2(cospim8, &bf1[17], cospi56, &bf1[30], rounding, bit);
  bf1[30] = half_btf_avx2(cospi56, &bf1[17], cospi8, &bf1[30], rounding, bit);
  bf1[17] = temp1;

  temp2 = half_btf_avx2(cospim56, &bf1[18], cospim8, &bf1[29], rounding, bit);
  bf1[29] = half_btf_avx2(cospim8, &bf1[18], cospi56, &bf1[29], rounding, bit);
  bf1[18] = temp2;

  temp1 = half_btf_avx2(cospim40, &bf1[21], cospi24, &bf1[26], rounding, bit);
  bf1[26] = half_btf_avx2(cospi24, &bf1[21], cospi40, &bf1[26], rounding, bit);
  bf1[21] = temp1;

  temp2 = half_btf_avx2(cospim24, &bf1[22], cospim40, &bf1[25], rounding, bit);
  bf1[25] = half_btf_avx2(cospim40, &bf1[22], cospi24, &bf1[25], rounding, bit);
  bf1[22] = temp2;
}